

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O3

int __thiscall arbiter::drivers::Fs::copy(Fs *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  runtime_error *prVar2;
  long *plVar3;
  long *plVar4;
  ofstream outstream;
  ifstream instream;
  long *local_4d8;
  long local_4d0;
  long local_4c8;
  long lStack_4c0;
  long *local_4b8;
  long local_4b0;
  long local_4a8;
  long lStack_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  string local_458;
  undefined1 local_438 [32];
  int aiStack_418 [54];
  ios_base local_340 [264];
  undefined1 local_238 [25];
  byte abStack_21f [7];
  int aiStack_218 [122];
  
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_458,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
  expandTilde((string *)local_238,&local_458);
  ::std::__cxx11::string::operator=((string *)dst,(string *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_478,*(long *)src,*(long *)(src + 8) + *(long *)src);
  expandTilde((string *)local_238,&local_478);
  ::std::__cxx11::string::operator=((string *)src,(string *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  ::std::ifstream::ifstream(local_238,(string *)dst,_S_in|_S_bin);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238._0_8_ + -0x18)) == 0) {
    abStack_21f[*(long *)(local_238._0_8_ + -0x18)] =
         abStack_21f[*(long *)(local_238._0_8_ + -0x18)] & 0xef;
    ::std::ofstream::ofstream(local_438,(string *)src,_S_trunc|_S_out|_S_bin);
    if (*(int *)((long)aiStack_418 + *(long *)(local_438._0_8_ + -0x18)) == 0) {
      ::std::ostream::operator<<((ostream *)local_438,(streambuf *)(local_238 + 0x10));
      local_438._0_8_ = _VTT;
      *(undefined8 *)(local_438 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
      ::std::filebuf::~filebuf((filebuf *)(local_438 + 8));
      ::std::ios_base::~ios_base(local_340);
      iVar1 = ::std::ifstream::~ifstream(local_238);
      return iVar1;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_498,"Could not open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src);
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_498);
    local_4d8 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_4d8 == plVar4) {
      local_4c8 = *plVar4;
      lStack_4c0 = plVar3[3];
      local_4d8 = &local_4c8;
    }
    else {
      local_4c8 = *plVar4;
    }
    local_4d0 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ::std::runtime_error::runtime_error(prVar2,(string *)&local_4d8);
    *(undefined ***)prVar2 = &PTR__runtime_error_001950e8;
    __cxa_throw(prVar2,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                   "Could not open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dst);
  plVar3 = (long *)::std::__cxx11::string::append(local_438);
  local_4b8 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_4b8 == plVar4) {
    local_4a8 = *plVar4;
    lStack_4a0 = plVar3[3];
    local_4b8 = &local_4a8;
  }
  else {
    local_4a8 = *plVar4;
  }
  local_4b0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  ::std::runtime_error::runtime_error(prVar2,(string *)&local_4b8);
  *(undefined ***)prVar2 = &PTR__runtime_error_001950e8;
  __cxa_throw(prVar2,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Fs::copy(std::string src, std::string dst) const
{
    src = expandTilde(src);
    dst = expandTilde(dst);

    std::ifstream instream(src, std::ifstream::in | std::ifstream::binary);
    if (!instream.good())
    {
        throw ArbiterError("Could not open " + src + " for reading");
    }
    instream >> std::noskipws;

    std::ofstream outstream(dst, binaryTruncMode);
    if (!outstream.good())
    {
        throw ArbiterError("Could not open " + dst + " for writing");
    }

    outstream << instream.rdbuf();
}